

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsAttributeSet
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attr,BOOL *isNumericPropertyId)

{
  BOOL BVar1;
  uint32 local_3c;
  ScriptContext *pSStack_38;
  uint32 index;
  ScriptContext *scriptContext;
  BOOL *isNumericPropertyId_local;
  PropertyAttributes attr_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext = (ScriptContext *)isNumericPropertyId;
  isNumericPropertyId_local._3_1_ = attr;
  isNumericPropertyId_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSStack_38 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_38,isNumericPropertyId_local._4_4_,&local_3c);
  *(BOOL *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = BVar1;
  if (*(int *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo == 0) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = IsAttributeSet(this,local_3c,isNumericPropertyId_local._3_1_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsAttributeSet(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attr, BOOL& isNumericPropertyId)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        isNumericPropertyId = scriptContext->IsNumericPropertyId(propertyId, &index);
        if (isNumericPropertyId)
        {
            return IsAttributeSet(index, attr);
        }

        return true;
    }